

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void __thiscall spirv_cross::SPIRConstant::SPIRConstant(SPIRConstant *this,uint32_t constant_type_)

{
  uint32_t constant_type__local;
  SPIRConstant *this_local;
  
  IVariant::IVariant(&this->super_IVariant);
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRConstant_005be8c8;
  TypedID<(spirv_cross::Types)1>::TypedID
            ((TypedID<(spirv_cross::Types)1> *)&(this->super_IVariant).field_0xc,constant_type_);
  ConstantMatrix::ConstantMatrix(&this->m);
  this->specialization = false;
  this->is_used_as_array_length = false;
  this->is_used_as_lut = false;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::SmallVector(&this->subconstants);
  ::std::__cxx11::string::string((string *)&this->specialization_constant_macro_name);
  return;
}

Assistant:

explicit SPIRConstant(uint32_t constant_type_)
	    : constant_type(constant_type_)
	{
	}